

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

operand_immediate_type assembler::anon_unknown_0::get_operand_immediate_type(operation *op)

{
  operand_immediate_type oVar1;
  
  oVar1 = _32BIT;
  switch((int)op) {
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
    break;
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
    oVar1 = _8BIT;
    break;
  default:
    if ((int)op != 3) {
      return _VARIABLE;
    }
  }
  return oVar1;
}

Assistant:

operand_immediate_type get_operand_immediate_type(const asmcode::operation& op)
    {
    switch (op)
      {
      case asmcode::CALL: return _32BIT;
      case asmcode::JE: return _32BIT;
      case asmcode::JL: return _32BIT;
      case asmcode::JLE:return _32BIT;
      case asmcode::JA: return _32BIT;
      case asmcode::JB: return _32BIT;
      case asmcode::JG: return _32BIT;
      case asmcode::JGE:return _32BIT;
      case asmcode::JNE:return _32BIT;
      case asmcode::JMP:return _32BIT;
      case asmcode::JES: return _8BIT;
      case asmcode::JLS: return _8BIT;
      case asmcode::JLES: return _8BIT;
      case asmcode::JAS: return _8BIT;
      case asmcode::JBS: return _8BIT;
      case asmcode::JGS: return _8BIT;
      case asmcode::JGES: return _8BIT;
      case asmcode::JNES: return _8BIT;
      case asmcode::JMPS: return _8BIT;
      default: return _VARIABLE;
      }
    }